

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_operator.cpp
# Opt level: O2

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::Transformer::TransformInExpression(Transformer *this,string *name,PGAExpr *root)

{
  Transformer *pTVar1;
  Transformer *pTVar2;
  bool bVar3;
  PGList *list;
  pointer pOVar4;
  long in_RCX;
  ExpressionType operator_type;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> expr;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  children;
  ExpressionType local_52 [2];
  undefined1 local_50 [16];
  Transformer *local_40;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  local_38;
  
  TransformExpression((Transformer *)(local_50 + 8),
                      (optional_ptr<duckdb_libpgquery::PGNode,_true>)name);
  bVar3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            root,"<>");
  local_52[0] = bVar3 + COMPARE_IN;
  if (**(int **)(in_RCX + 0x18) == 0xde) {
    make_uniq<duckdb::OperatorExpression,duckdb::ExpressionType&,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((duckdb *)&local_38,local_52,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)(local_50 + 8));
    local_50._0_8_ = *(long *)(in_RCX + 0x18);
    list = optional_ptr<duckdb_libpgquery::PGList,_true>::operator*
                     ((optional_ptr<duckdb_libpgquery::PGList,_true> *)local_50);
    pOVar4 = unique_ptr<duckdb::OperatorExpression,_std::default_delete<duckdb::OperatorExpression>,_true>
             ::operator->((unique_ptr<duckdb::OperatorExpression,_std::default_delete<duckdb::OperatorExpression>,_true>
                           *)&local_38);
    TransformExpressionList((Transformer *)name,list,&pOVar4->children);
    (this->parent).ptr =
         (Transformer *)
         local_38.
         super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  else {
    TransformExpression((Transformer *)local_50,(PGNode *)name);
    local_38.
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_38.
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_38.
    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)&local_38,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)local_50);
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)&local_38,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)(local_50 + 8));
    make_uniq_base<duckdb::ParsedExpression,duckdb::FunctionExpression,char_const(&)[9],duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
              ((duckdb *)this,(char (*) [9])0x1fc93c8,
               (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                *)&local_38);
    if (bVar3) {
      local_52[1] = 0xd;
      make_uniq_base<duckdb::ParsedExpression,duckdb::OperatorExpression,duckdb::ExpressionType,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                ((duckdb *)&local_40,local_52 + 1,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)this);
      pTVar2 = local_40;
      local_40 = (Transformer *)0x0;
      pTVar1 = (this->parent).ptr;
      (this->parent).ptr = pTVar2;
      if (pTVar1 != (Transformer *)0x0) {
        (*(code *)((pTVar1->parent).ptr)->options)();
        if (local_40 != (Transformer *)0x0) {
          (*(code *)((local_40->parent).ptr)->options)();
        }
      }
    }
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ::~vector(&local_38);
    if ((Transformer *)local_50._0_8_ != (Transformer *)0x0) {
      (*(code *)((optional_ptr<duckdb::Transformer,_true> *)local_50._0_8_)->ptr->options)();
    }
  }
  if ((ParserOptions *)local_50._8_8_ != (ParserOptions *)0x0) {
    (**(code **)(*(long *)(bool *)local_50._8_8_ + 8))();
  }
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)this;
}

Assistant:

unique_ptr<ParsedExpression> Transformer::TransformInExpression(const string &name, duckdb_libpgquery::PGAExpr &root) {
	auto left_expr = TransformExpression(root.lexpr);
	ExpressionType operator_type;
	// this looks very odd, but seems to be the way to find out its NOT IN
	if (name == "<>") {
		// NOT IN
		operator_type = ExpressionType::COMPARE_NOT_IN;
	} else {
		// IN
		operator_type = ExpressionType::COMPARE_IN;
	}

	if (root.rexpr->type == duckdb_libpgquery::T_PGList) {
		auto result = make_uniq<OperatorExpression>(operator_type, std::move(left_expr));
		TransformExpressionList(*PGPointerCast<duckdb_libpgquery::PGList>(root.rexpr), result->children);
		return std::move(result);
	}
	auto expr = TransformExpression(*root.rexpr);

	vector<unique_ptr<ParsedExpression>> children;
	children.push_back(std::move(expr));
	children.push_back(std::move(left_expr));
	auto result = make_uniq_base<ParsedExpression, FunctionExpression>("contains", std::move(children));
	if (operator_type == ExpressionType::COMPARE_NOT_IN) {
		result = make_uniq_base<ParsedExpression, OperatorExpression>(ExpressionType::OPERATOR_NOT, std::move(result));
	}
	return result;
}